

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O1

bool __thiscall Clasp::SolveAlgorithm::reportModel(SolveAlgorithm *this,Solver *s,bool sym)

{
  ModelHandler *pMVar1;
  LogPtr pEVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  byte unaff_BPL;
  Model *m;
  byte bVar6;
  
  m = (Model *)(((this->enum_).ptr_ & 0xfffffffffffffffe) + 0x48);
  do {
    pMVar1 = this->onModel_;
    if (pMVar1 == (ModelHandler *)0x0) {
      bVar6 = 0;
    }
    else {
      iVar5 = (*pMVar1->_vptr_ModelHandler[2])(pMVar1,s,m);
      bVar6 = (byte)iVar5 ^ 1;
    }
    if ((this->reportM_ == true) && (pEVar2 = s->shared_->progress_, pEVar2 != (LogPtr)0x0)) {
      iVar5 = (*(pEVar2->super_ModelHandler)._vptr_ModelHandler[2])(pEVar2,s,m);
      bVar3 = (byte)iVar5 ^ 1;
    }
    else {
      bVar3 = 0;
    }
    if ((bVar6 != 0 || bVar3 != 0) || (bVar4 = hasLimit(this,m), bVar4)) {
      unaff_BPL = 0;
      bVar4 = false;
    }
    else {
      iVar5 = (*this->_vptr_SolveAlgorithm[2])(this);
      if ((byte)iVar5 == 0 && sym) {
        bVar4 = Enumerator::commitSymmetric
                          ((Enumerator *)((this->enum_).ptr_ & 0xfffffffffffffffe),s);
        unaff_BPL = !bVar4 | unaff_BPL;
      }
      else {
        unaff_BPL = (byte)iVar5 ^ 1;
        bVar4 = false;
      }
    }
  } while (bVar4 != false);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool SolveAlgorithm::reportModel(Solver& s, bool sym) const {
	for (const Model& m = model();;) {
		bool r1 = !onModel_ || onModel_->onModel(s, m);
		bool r2 = !reportM_ || s.sharedContext()->report(s, m);
		if (!r1 || !r2 || hasLimit(m) || interrupted()) { return false; }
		if (!sym || !enum_->commitSymmetric(s))         { return true;  }
	}
}